

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Select_Browser.H
# Opt level: O2

void __thiscall Fl_Select_Browser::~Fl_Select_Browser(Fl_Select_Browser *this)

{
  Fl_Browser::~Fl_Browser(&this->super_Fl_Browser);
  operator_delete(this,0x2a0);
  return;
}

Assistant:

class FL_EXPORT Fl_Select_Browser : public Fl_Browser {
public:
  /**
    Creates a new Fl_Select_Browser widget using the given
    position, size, and label string. The default boxtype is FL_DOWN_BOX.
    The constructor specializes Fl_Browser() by setting the type to FL_SELECT_BROWSER.
    The destructor destroys the widget and frees all memory that has been allocated.
  */
  Fl_Select_Browser(int X,int Y,int W,int H,const char *L=0);
}